

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O1

int32_t __thiscall
cornelich::vanilla_index::last_index_file_number
          (vanilla_index *this,int32_t cycle,int32_t default_cycle)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  int32_t index;
  string_type name;
  directory_iterator __begin1;
  type context;
  directory_iterator __end1;
  directory_iterator end;
  directory_iterator begin;
  path path;
  error_code err;
  any_int_parser<int,10u,1u,_1> local_10d;
  int local_10c;
  path local_108;
  directory_iterator local_e8;
  path local_e0;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_c0;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_b8;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_b0;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_a8;
  int32_t local_9c;
  iterator_range<boost::filesystem::directory_iterator> local_98;
  directory_iterator local_88;
  path local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string local_50;
  
  paVar1 = &local_108.m_pathname.field_2;
  pcVar2 = (this->m_settings->m_path)._M_dataplus._M_p;
  local_108.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar2,pcVar2 + (this->m_settings->m_path)._M_string_length);
  cycle_formatter::date_from_cycle_abi_cxx11_
            (&local_50,
             (this->m_settings->m_cycle_format).
             super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (long)cycle);
  local_e0.m_pathname._M_dataplus._M_p = (pointer)&local_e0.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  boost::filesystem::path::operator/=(&local_108,&local_e0);
  local_80.m_pathname._M_dataplus._M_p = (pointer)&local_80.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.m_pathname._M_dataplus._M_p == paVar1) {
    local_80.m_pathname.field_2._8_8_ = local_108.m_pathname.field_2._8_8_;
  }
  else {
    local_80.m_pathname._M_dataplus._M_p = local_108.m_pathname._M_dataplus._M_p;
  }
  local_80.m_pathname._M_string_length = local_108.m_pathname._M_string_length;
  local_108.m_pathname._M_string_length = 0;
  local_108.m_pathname.field_2._M_local_buf[0] = '\0';
  local_108.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_pathname._M_dataplus._M_p != &local_e0.m_pathname.field_2) {
    operator_delete(local_e0.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.m_pathname._M_dataplus._M_p);
  }
  boost::system::error_code::error_code((error_code *)&local_50);
  boost::filesystem::directory_iterator::directory_iterator
            (&local_88,&local_80,(error_code *)&local_50);
  local_a8.px = (dir_itr_imp *)0x0;
  local_b0 = local_88.m_imp.px;
  if (local_88.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_88.m_imp.px = *(int *)local_88.m_imp.px + 1;
    UNLOCK();
  }
  local_b8.px = (dir_itr_imp *)0x0;
  local_108.m_pathname._M_dataplus._M_p = (pointer)local_88.m_imp.px;
  if (local_88.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_88.m_imp.px = *(int *)local_88.m_imp.px + 1;
    UNLOCK();
  }
  local_e0.m_pathname._M_dataplus._M_p = (pointer)0x0;
  boost::iterator_range<boost::filesystem::directory_iterator>::
  iterator_range<boost::filesystem::directory_iterator>
            (&local_98,(directory_iterator *)&local_108,(directory_iterator *)&local_e0);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&local_e0);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&local_108);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_b8);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_b0);
  local_e8.m_imp.px =
       local_98.
       super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.m_imp.px;
  if (local_98.
      super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_98.
            super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
            .m_Begin.m_imp.px =
         *(int *)local_98.
                 super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin.m_imp.px + 1;
    UNLOCK();
  }
  local_c0 = local_98.
             super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
             .m_End.m_imp.px;
  if (local_98.
      super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
      .m_End.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_98.
            super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
            .m_End.m_imp.px =
         *(int *)local_98.
                 super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
                 .m_End.m_imp.px + 1;
    UNLOCK();
  }
  iVar3 = -1;
  local_9c = default_cycle;
  do {
    if ((local_e8.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_c0.px) ||
       (((local_e8.m_imp.px == (dir_itr_imp *)0x0 ||
         (*(long *)((long)local_e8.m_imp.px + 0x38) == 0)) &&
        ((local_c0.px == (dir_itr_imp *)0x0 || (*(long *)(local_c0.px + 0x38) == 0)))))) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_c0);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_e8.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                (&local_98.
                  super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
                  .m_End.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&local_98);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_a8);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_88.m_imp);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_pathname._M_dataplus._M_p != &local_80.m_pathname.field_2) {
        operator_delete(local_80.m_pathname._M_dataplus._M_p);
      }
      if (iVar3 != -1) {
        local_9c = iVar3;
      }
      return local_9c;
    }
    boost::filesystem::directory_iterator::dereference(&local_e8);
    boost::filesystem::path::filename();
    local_108.m_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,local_e0.m_pathname._M_dataplus._M_p,
               local_e0.m_pathname._M_dataplus._M_p + local_e0.m_pathname._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.m_pathname._M_dataplus._M_p != &local_e0.m_pathname.field_2) {
      operator_delete(local_e0.m_pathname._M_dataplus._M_p);
    }
    lVar4 = INDEX_FILE_NAME_PREFIX_abi_cxx11_;
    if (DAT_0011f378 != 0 && local_108.m_pathname._M_string_length != 0) {
      lVar5 = 0;
      do {
        if (local_108.m_pathname._M_dataplus._M_p[lVar5] !=
            *(char *)(INDEX_FILE_NAME_PREFIX_abi_cxx11_ + lVar5)) goto LAB_00111e0c;
        lVar4 = lVar5 + 1;
      } while ((local_108.m_pathname._M_string_length - 1 != lVar5) &&
              (bVar6 = DAT_0011f378 + -1 != lVar5, lVar5 = lVar4, bVar6));
      lVar4 = lVar4 + INDEX_FILE_NAME_PREFIX_abi_cxx11_;
    }
    if (lVar4 == INDEX_FILE_NAME_PREFIX_abi_cxx11_ + DAT_0011f378) {
      local_58._M_current =
           local_108.m_pathname._M_dataplus._M_p + local_108.m_pathname._M_string_length;
      local_10c = -1;
      local_60._M_current = local_108.m_pathname._M_dataplus._M_p + DAT_0011f378 + -1;
      local_e0.m_pathname._M_dataplus._M_p = (pointer)&local_10c;
      boost::spirit::qi::any_int_parser<int,10u,1u,-1>::
      parse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<int&,boost::fusion::nil_>,boost::spirit::locals<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::spirit::unused_type,int>
                (&local_10d,&local_60,&local_58,
                 (context<boost::fusion::cons<int_&,_boost::fusion::nil_>,_boost::spirit::locals<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>
                  *)&local_e0,(unused_type *)&boost::spirit::unused,&local_10c);
      if (iVar3 <= local_10c) {
        iVar3 = local_10c;
      }
    }
LAB_00111e0c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_108.m_pathname._M_dataplus._M_p);
    }
    boost::filesystem::detail::directory_iterator_increment(&local_e8,(error_code *)0x0);
  } while( true );
}

Assistant:

std::int32_t vanilla_index::last_index_file_number(std::int32_t cycle, std::int32_t default_cycle) const
{
    std::int32_t last_number = -1;
    const auto path = fs::path(m_settings.path()) / m_settings.cycle_format().date_from_cycle(cycle);

    boost::system::error_code err;
    fs::directory_iterator begin(path, err);
    fs::directory_iterator end;

    // Find the last index file in the specified cycle directory
    for(const auto & entry : boost::make_iterator_range(begin, end))
    {
        auto name = entry.path().filename().native();
        if(boost::algorithm::starts_with(name, INDEX_FILE_NAME_PREFIX))
        {
            std::int32_t index = -1;
            util::parse_number(name.begin() + static_cast<std::string::difference_type>(INDEX_FILE_NAME_PREFIX.size()) - 1, name.end(), index);
            if(last_number < index)
                last_number = index;
        }
    }
    return last_number == -1 ? default_cycle : last_number;
}